

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_CutRef_rec(Of_Man_t *p,int *pCut)

{
  Of_Obj_t *pOVar1;
  int iVar2;
  uint iObj;
  int iVar3;
  int *pCut_00;
  uint v;
  
  if ((p->Iter & 1) == 0) {
    iVar2 = 0;
    if (1 < (*pCut & 0x1fU)) {
      iVar2 = (*pCut & 0x1fU) + p->pPars->nAreaTuner;
    }
  }
  else {
    iVar2 = 1;
  }
  v = 0;
  while( true ) {
    if ((*pCut & 0x1fU) <= v) {
      return iVar2;
    }
    iObj = Of_CutVar(pCut,v);
    if (iObj == 0) break;
    pOVar1 = p->pObjs;
    if ((pOVar1[iObj].iCutH != 0) &&
       (iVar3 = pOVar1[iObj].nRefs, pOVar1[iObj].nRefs = iVar3 + 1, iVar3 == 0)) {
      pCut_00 = Of_ObjCutBestP(p,iObj);
      iVar3 = Of_CutRef_rec(p,pCut_00);
      iVar2 = iVar2 + iVar3;
    }
    v = v + 1;
  }
  return iVar2;
}

Assistant:

int Of_CutRef_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefInc(p, Var) )
            Count += Of_CutRef_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}